

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

int64_t __thiscall
icu_63::number::impl::DecimalQuantity::toLong(DecimalQuantity *this,bool truncateIfOverflow)

{
  int8_t iVar1;
  bool bVar2;
  int *piVar3;
  long lVar4;
  int local_38;
  int local_34;
  int32_t magnitude;
  int local_2c;
  DecimalQuantity *pDStack_28;
  int32_t upperMagnitude;
  uint64_t result;
  DecimalQuantity *pDStack_18;
  bool truncateIfOverflow_local;
  DecimalQuantity *this_local;
  
  pDStack_28 = (DecimalQuantity *)0x0;
  magnitude = this->scale + this->precision;
  result._7_1_ = truncateIfOverflow;
  pDStack_18 = this;
  piVar3 = std::min<int>(&magnitude,&this->lOptPos);
  local_2c = *piVar3 + -1;
  if ((result._7_1_ & 1) != 0) {
    local_34 = 0x11;
    piVar3 = std::min<int>(&local_2c,&local_34);
    local_2c = *piVar3;
  }
  for (local_38 = local_2c; -1 < local_38; local_38 = local_38 + -1) {
    lVar4 = (long)pDStack_28 * 10;
    iVar1 = getDigitPos(this,local_38 - this->scale);
    pDStack_28 = (DecimalQuantity *)(lVar4 + iVar1);
  }
  bVar2 = isNegative(this);
  if (bVar2) {
    this_local = (DecimalQuantity *)-(long)pDStack_28;
  }
  else {
    this_local = pDStack_28;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t DecimalQuantity::toLong(bool truncateIfOverflow) const {
    // NOTE: Call sites should be guarded by fitsInLong(), like this:
    // if (dq.fitsInLong()) { /* use dq.toLong() */ } else { /* use some fallback */ }
    // Fallback behavior upon truncateIfOverflow is to truncate at 17 digits.
    uint64_t result = 0L;
    int32_t upperMagnitude = std::min(scale + precision, lOptPos) - 1;
    if (truncateIfOverflow) {
        upperMagnitude = std::min(upperMagnitude, 17);
    }
    for (int32_t magnitude = upperMagnitude; magnitude >= 0; magnitude--) {
        result = result * 10 + getDigitPos(magnitude - scale);
    }
    if (isNegative()) {
        return static_cast<int64_t>(0LL - result); // i.e., -result
    }
    return static_cast<int64_t>(result);
}